

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo(AutoRestoreFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  Attributes AVar3;
  FunctionInfo *pFVar4;
  ParseableFunctionInfo *pPVar5;
  FunctionProxy *this_00;
  FunctionBody *this_01;
  undefined4 *puVar6;
  FunctionBody *functionBody;
  FunctionInfo *functionInfo;
  AutoRestoreFunctionInfo *this_local;
  
  if (this->pfi != (ParseableFunctionInfo *)0x0) {
    pFVar4 = FunctionProxy::GetFunctionInfo(&this->pfi->super_FunctionProxy);
    pPVar5 = (ParseableFunctionInfo *)FunctionInfo::GetFunctionProxy(pFVar4);
    if (pPVar5 != this->pfi) {
      pFVar4 = FunctionProxy::GetFunctionInfo(&this->pfi->super_FunctionProxy);
      this_00 = FunctionInfo::GetFunctionProxy(pFVar4);
      this_01 = FunctionProxy::GetFunctionBody(this_00);
      FunctionBody::RedeferFunctionObjectTypes(this_01);
      AVar3 = FunctionInfo::GetAttributes(pFVar4);
      FunctionInfo::SetAttributes(pFVar4,AVar3 | DeferredParse);
      FunctionInfo::SetFunctionProxy(pFVar4,&this->pfi->super_FunctionProxy);
      FunctionInfo::SetOriginalEntryPoint(pFVar4,this->originalEntryPoint);
    }
  }
  if (this->pfi != (ParseableFunctionInfo *)0x0) {
    pFVar4 = FunctionProxy::GetFunctionInfo(&this->pfi->super_FunctionProxy);
    pPVar5 = (ParseableFunctionInfo *)FunctionInfo::GetFunctionProxy(pFVar4);
    if ((pPVar5 != this->pfi) ||
       (bVar2 = FunctionProxy::IsFunctionBody(&this->pfi->super_FunctionProxy), bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0xd86,
                                  "(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()))"
                                  ,
                                  "this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

~AutoRestoreFunctionInfo() {
            if (this->pfi != nullptr && this->pfi->GetFunctionInfo()->GetFunctionProxy() != this->pfi)
            {
                FunctionInfo *functionInfo = this->pfi->GetFunctionInfo();
                FunctionBody *functionBody = functionInfo->GetFunctionProxy()->GetFunctionBody();
                functionBody->RedeferFunctionObjectTypes();
                functionInfo->SetAttributes(
                    (FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
                functionInfo->SetFunctionProxy(this->pfi);
                functionInfo->SetOriginalEntryPoint(originalEntryPoint);
            }

            Assert(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()));
        }